

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsSamplers.h
# Opt level: O1

PointVector * __thiscall
chrono::utils::GridSampler<double>::Sample
          (PointVector *__return_storage_ptr__,GridSampler<double> *this,VolumeType t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined8 in_RCX;
  socklen_t *__addr_len;
  int iVar11;
  bool bVar12;
  ChVector<double> p;
  socklen_t *local_90;
  socklen_t *local_88;
  double local_48;
  double dStack_40;
  double local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = (this->super_Sampler<double>).m_size.m_data[0];
  iVar7 = (int)((dVar1 + dVar1) / (this->m_sep3D).m_data[0]);
  if (-1 < iVar7) {
    dVar2 = (this->super_Sampler<double>).m_center.m_data[0];
    dVar3 = (this->super_Sampler<double>).m_center.m_data[1];
    dVar4 = (this->super_Sampler<double>).m_size.m_data[1];
    dVar5 = (this->super_Sampler<double>).m_center.m_data[2];
    dVar6 = (this->super_Sampler<double>).m_size.m_data[2];
    iVar8 = (int)((dVar6 + dVar6) / (this->m_sep3D).m_data[2]);
    iVar10 = (int)((dVar4 + dVar4) / (this->m_sep3D).m_data[1]);
    local_90 = (socklen_t *)0x0;
    __addr_len = (socklen_t *)CONCAT44((int)((ulong)in_RCX >> 0x20),iVar10);
    do {
      if (-1 < iVar10) {
        local_88 = (socklen_t *)0x0;
        do {
          if (-1 < iVar8) {
            iVar11 = 0;
            do {
              local_48 = (double)(int)local_90 * (this->m_sep3D).m_data[0] + (dVar2 - dVar1);
              dStack_40 = (double)(int)local_88 * (this->m_sep3D).m_data[1] + (dVar3 - dVar4);
              local_38 = (double)iVar11 * (this->m_sep3D).m_data[2] + (dVar5 - dVar6);
              iVar9 = Sampler<double>::accept
                                (&this->super_Sampler<double>,t,(sockaddr *)&local_48,__addr_len);
              if ((char)iVar9 != '\0') {
                std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
                push_back(__return_storage_ptr__,(value_type *)&local_48);
              }
              iVar11 = iVar11 + 1;
            } while (iVar8 + 1 != iVar11);
          }
          bVar12 = (int)local_88 != iVar10;
          __addr_len = local_88;
          local_88 = (socklen_t *)(ulong)((int)local_88 + 1);
        } while (bVar12);
      }
      bVar12 = (int)local_90 != iVar7;
      __addr_len = local_90;
      local_90 = (socklen_t *)(ulong)((int)local_90 + 1);
    } while (bVar12);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual PointVector Sample(VolumeType t) override {
        PointVector out_points;

        ChVector<T> bl = this->m_center - this->m_size;

        int nx = (int)(2 * this->m_size.x() / m_sep3D.x()) + 1;
        int ny = (int)(2 * this->m_size.y() / m_sep3D.y()) + 1;
        int nz = (int)(2 * this->m_size.z() / m_sep3D.z()) + 1;

        for (int i = 0; i < nx; i++) {
            for (int j = 0; j < ny; j++) {
                for (int k = 0; k < nz; k++) {
                    ChVector<T> p = bl + ChVector<T>(i * m_sep3D.x(), j * m_sep3D.y(), k * m_sep3D.z());
                    if (this->accept(t, p))
                        out_points.push_back(p);
                }
            }
        }

        return out_points;
    }